

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtrsv.c
# Opt level: O2

void dtrsv_(char *uplo,char *trans,char *diag,integer *n,doublereal *a,integer *lda,doublereal *x,
           integer *incx)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  doublereal *pdVar16;
  double *pdVar17;
  double *pdVar18;
  int iVar19;
  long lVar20;
  uint uVar21;
  bool bVar22;
  double dVar23;
  int local_40 [4];
  
  cVar1 = *uplo;
  if ((cVar1 == 'L') || (cVar1 == 'U')) {
    uVar4 = (byte)*trans - 0x43;
    if ((uVar4 < 0x12) && ((0x20801U >> (uVar4 & 0x1f) & 1) != 0)) {
      cVar2 = *diag;
      if ((cVar2 == 'N') || (cVar2 == 'U')) {
        uVar4 = *n;
        uVar7 = (ulong)uVar4;
        if ((int)uVar4 < 0) {
          local_40[0] = 4;
        }
        else {
          uVar3 = *lda;
          if ((int)uVar3 < (int)(uVar4 + (uVar4 == 0))) {
            local_40[0] = 6;
          }
          else {
            iVar12 = *incx;
            lVar8 = (long)iVar12;
            if (lVar8 != 0) {
              if (uVar4 == 0) {
                return;
              }
              uVar9 = uVar4 - 1;
              iVar14 = iVar12 * uVar9;
              iVar15 = 1;
              iVar6 = 1 - iVar14;
              if (0 < iVar12) {
                iVar6 = 1;
              }
              if (*trans != 0x4e) {
                if (cVar1 != 'U') {
                  if (iVar12 == 1) {
                    iVar12 = uVar9 * uVar3 + -1;
                    while (iVar15 = (int)uVar7, 0 < iVar15) {
                      uVar7 = uVar7 - 1;
                      dVar23 = x[uVar7 & 0xffffffff];
                      uVar10 = (ulong)uVar4;
                      while (iVar6 = (int)uVar10, iVar15 < iVar6) {
                        uVar10 = (ulong)(iVar6 - 1);
                        dVar23 = dVar23 - a[iVar12 + iVar6] * x[uVar10];
                      }
                      if (cVar2 == 'N') {
                        dVar23 = dVar23 / a[(int)((uVar3 + 1) * (int)uVar7)];
                      }
                      x[uVar7 & 0xffffffff] = dVar23;
                      iVar12 = iVar12 - uVar3;
                    }
                    return;
                  }
                  iVar13 = uVar9 * uVar3 + -1;
                  uVar9 = uVar4;
                  iVar15 = iVar6 + iVar14;
                  while (0 < (int)uVar9) {
                    dVar23 = x[(long)iVar15 + -1];
                    iVar19 = iVar6 + iVar14;
                    for (uVar21 = uVar4; (int)uVar9 < (int)uVar21; uVar21 = uVar21 - 1) {
                      dVar23 = dVar23 - a[(int)(iVar13 + uVar21)] * x[(long)iVar19 + -1];
                      iVar19 = iVar19 - iVar12;
                    }
                    if (cVar2 == 'N') {
                      dVar23 = dVar23 / a[(int)((uVar3 + 1) * (uVar9 - 1))];
                    }
                    x[(long)iVar15 + -1] = dVar23;
                    iVar15 = iVar15 - iVar12;
                    iVar13 = iVar13 - uVar3;
                    uVar9 = uVar9 - 1;
                  }
                  return;
                }
                if (iVar12 == 1) {
                  lVar11 = 0;
                  pdVar16 = a;
                  for (lVar8 = 1; lVar8 != uVar7 + 1; lVar8 = lVar8 + 1) {
                    dVar23 = x[lVar8 + -1];
                    for (lVar20 = 0; lVar11 != lVar20; lVar20 = lVar20 + 8) {
                      dVar23 = dVar23 - *(double *)((long)pdVar16 + lVar20) *
                                        *(double *)((long)x + lVar20);
                    }
                    if (cVar2 == 'N') {
                      dVar23 = dVar23 / a[(int)(((int)lVar8 + -1) * (uVar3 + 1))];
                    }
                    x[lVar8 + -1] = dVar23;
                    lVar11 = lVar11 + 8;
                    pdVar16 = pdVar16 + (int)uVar3;
                  }
                  return;
                }
                lVar20 = (long)iVar6;
                lVar11 = lVar20 + -1;
                iVar12 = 0;
                iVar6 = 0;
                for (; iVar15 != uVar4 + 1; iVar15 = iVar15 + 1) {
                  dVar23 = x[lVar20 + -1];
                  pdVar17 = x + lVar11;
                  iVar14 = iVar12;
                  iVar13 = iVar6;
                  while (bVar22 = iVar13 != 0, iVar13 = iVar13 + -1, bVar22) {
                    dVar23 = dVar23 - a[iVar14] * *pdVar17;
                    pdVar17 = pdVar17 + lVar8;
                    iVar14 = iVar14 + 1;
                  }
                  if (cVar2 == 'N') {
                    dVar23 = dVar23 / a[(int)((iVar15 + -1) * (uVar3 + 1))];
                  }
                  x[lVar20 + -1] = dVar23;
                  lVar20 = lVar20 + lVar8;
                  iVar6 = iVar6 + 1;
                  iVar12 = iVar12 + uVar3;
                }
                return;
              }
              if (cVar1 != 'U') {
                if (iVar12 == 1) {
                  iVar12 = 1;
                  for (uVar10 = 1; uVar10 != uVar7 + 1; uVar10 = uVar10 + 1) {
                    dVar23 = x[uVar10 - 1];
                    if ((dVar23 != 0.0) || (NAN(dVar23))) {
                      if (cVar2 == 'N') {
                        dVar23 = dVar23 / a[(int)(((int)uVar10 + -1) * (uVar3 + 1))];
                        x[uVar10 - 1] = dVar23;
                      }
                      iVar15 = iVar12;
                      for (uVar5 = uVar10; uVar5 < uVar7; uVar5 = uVar5 + 1) {
                        x[uVar5] = a[iVar15] * -dVar23 + x[uVar5];
                        iVar15 = iVar15 + 1;
                      }
                    }
                    iVar12 = iVar12 + uVar3 + 1;
                  }
                  return;
                }
                lVar11 = (long)iVar6;
                pdVar17 = x + lVar11 + lVar8 + -1;
                iVar12 = 1;
                for (iVar15 = 1; iVar15 != uVar4 + 1; iVar15 = iVar15 + 1) {
                  dVar23 = x[lVar11 + -1];
                  if ((dVar23 != 0.0) || (NAN(dVar23))) {
                    if (cVar2 == 'N') {
                      dVar23 = dVar23 / a[(int)((iVar15 + -1) * (uVar3 + 1))];
                      x[lVar11 + -1] = dVar23;
                    }
                    pdVar18 = pdVar17;
                    iVar14 = iVar12;
                    for (iVar6 = iVar15; iVar6 < (int)uVar4; iVar6 = iVar6 + 1) {
                      *pdVar18 = a[iVar14] * -dVar23 + *pdVar18;
                      pdVar18 = pdVar18 + lVar8;
                      iVar14 = iVar14 + 1;
                    }
                  }
                  lVar11 = lVar11 + lVar8;
                  pdVar17 = pdVar17 + lVar8;
                  iVar12 = iVar12 + uVar3 + 1;
                }
                return;
              }
              if (iVar12 == 1) {
                iVar12 = uVar3 * uVar9 + uVar4 + -2;
                while (0 < (int)uVar7) {
                  uVar7 = uVar7 - 1;
                  dVar23 = x[uVar7 & 0xffffffff];
                  if ((dVar23 != 0.0) || (NAN(dVar23))) {
                    if (cVar2 == 'N') {
                      dVar23 = dVar23 / a[(int)((uVar3 + 1) * (int)uVar7)];
                      x[uVar7 & 0xffffffff] = dVar23;
                    }
                    iVar15 = iVar12;
                    uVar4 = uVar9;
                    while (0 < (int)uVar4) {
                      uVar4 = uVar4 - 1;
                      x[uVar4] = a[iVar15] * -dVar23 + x[uVar4];
                      iVar15 = iVar15 + -1;
                    }
                  }
                  uVar9 = uVar9 - 1;
                  iVar12 = iVar12 + ~uVar3;
                }
                return;
              }
              iVar14 = iVar14 + iVar6;
              iVar15 = uVar9 * uVar3 + uVar4 + -2;
              iVar6 = (uVar4 - 2) * iVar12 + iVar6;
              while (0 < (int)uVar7) {
                dVar23 = x[(long)iVar14 + -1];
                uVar4 = (int)uVar7 - 1;
                uVar7 = (ulong)uVar4;
                if ((dVar23 != 0.0) || (NAN(dVar23))) {
                  if (cVar2 == 'N') {
                    dVar23 = dVar23 / a[(int)((uVar3 + 1) * uVar4)];
                    x[(long)iVar14 + -1] = dVar23;
                  }
                  iVar13 = iVar6;
                  iVar19 = iVar15;
                  for (uVar10 = uVar7; 0 < (int)uVar10; uVar10 = (ulong)((int)uVar10 - 1)) {
                    x[(long)iVar13 + -1] = a[iVar19] * -dVar23 + x[(long)iVar13 + -1];
                    iVar19 = iVar19 + -1;
                    iVar13 = iVar13 - iVar12;
                  }
                }
                iVar14 = iVar14 - iVar12;
                iVar15 = iVar15 + ~uVar3;
                iVar6 = iVar6 - iVar12;
              }
              return;
            }
            local_40[0] = 8;
          }
        }
      }
      else {
        local_40[0] = 3;
      }
    }
    else {
      local_40[0] = 2;
    }
  }
  else {
    local_40[0] = 1;
  }
  input_error("DTRSV ",local_40);
  return;
}

Assistant:

void dtrsv_(char *uplo, char *trans, char *diag, integer *n, 
	doublereal *a, integer *lda, doublereal *x, integer *incx)
{


    /* System generated locals */

    /* Local variables */
    integer info;
    doublereal temp;
    integer i, j;
    integer ix, jx, kx;
    logical nounit;

    extern int input_error(char *, int *);

/*  Purpose   
    =======   

    DTRSV  solves one of the systems of equations   

       A*x = b,   or   A'*x = b,   

    where b and x are n element vectors and A is an n by n unit, or   
    non-unit, upper or lower triangular matrix.   

    No test for singularity or near-singularity is included in this   
    routine. Such tests must be performed before calling this routine.   

    Parameters   
    ==========   

    UPLO   - CHARACTER*1.   
             On entry, UPLO specifies whether the matrix is an upper or   
             lower triangular matrix as follows:   

                UPLO = 'U' or 'u'   A is an upper triangular matrix.   

                UPLO = 'L' or 'l'   A is a lower triangular matrix.   

             Unchanged on exit.   

    TRANS  - CHARACTER*1.   
             On entry, TRANS specifies the equations to be solved as   
             follows:   

                TRANS = 'N' or 'n'   A*x = b.   

                TRANS = 'T' or 't'   A'*x = b.   

                TRANS = 'C' or 'c'   A'*x = b.   

             Unchanged on exit.   

    DIAG   - CHARACTER*1.   
             On entry, DIAG specifies whether or not A is unit   
             triangular as follows:   

                DIAG = 'U' or 'u'   A is assumed to be unit triangular.   

                DIAG = 'N' or 'n'   A is not assumed to be unit   
                                    triangular.   

             Unchanged on exit.   

    N      - INTEGER.   
             On entry, N specifies the order of the matrix A.   
             N must be at least zero.   
             Unchanged on exit.   

    A      - DOUBLE PRECISION array of DIMENSION ( LDA, n ).   
             Before entry with  UPLO = 'U' or 'u', the leading n by n   
             upper triangular part of the array A must contain the upper 
  
             triangular matrix and the strictly lower triangular part of 
  
             A is not referenced.   
             Before entry with UPLO = 'L' or 'l', the leading n by n   
             lower triangular part of the array A must contain the lower 
  
             triangular matrix and the strictly upper triangular part of 
  
             A is not referenced.   
             Note that when  DIAG = 'U' or 'u', the diagonal elements of 
  
             A are not referenced either, but are assumed to be unity.   
             Unchanged on exit.   

    LDA    - INTEGER.   
             On entry, LDA specifies the first dimension of A as declared 
  
             in the calling (sub) program. LDA must be at least   
             max( 1, n ).   
             Unchanged on exit.   

    X      - DOUBLE PRECISION array of dimension at least   
             ( 1 + ( n - 1 )*abs( INCX ) ).   
             Before entry, the incremented array X must contain the n   
             element right-hand side vector b. On exit, X is overwritten 
  
             with the solution vector x.   

    INCX   - INTEGER.   
             On entry, INCX specifies the increment for the elements of   
             X. INCX must not be zero.   
             Unchanged on exit.   


    Level 2 Blas routine.   

    -- Written on 22-October-1986.   
       Jack Dongarra, Argonne National Lab.   
       Jeremy Du Croz, Nag Central Office.   
       Sven Hammarling, Nag Central Office.   
       Richard Hanson, Sandia National Labs.   



       Test the input parameters.   

    
   Parameter adjustments   
       Function Body */
#define X(I) x[(I)-1]

#define A(I,J) a[(I)-1 + ((J)-1)* ( *lda)]

    info = 0;
    if ( strncmp(uplo, "U", 1)!=0 && strncmp(uplo, "L", 1)!=0 ) {
	info = 1;
    } else if ( strncmp(trans, "N", 1)!=0 && strncmp(trans, "T", 1)!=0 &&
		strncmp(trans, "C", 1)!=0 ) {
	info = 2;
    } else if ( strncmp(diag, "U", 1)!=0 && strncmp(diag, "N", 1)!=0 ) {
	info = 3;
    } else if (*n < 0) {
	info = 4;
    } else if (*lda < max(1,*n)) {
	info = 6;
    } else if (*incx == 0) {
	info = 8;
    }
    if (info != 0) {
	input_error("DTRSV ", &info);
	return;
    }

/*     Quick return if possible. */

    if (*n == 0) {
	return;
    }

    nounit = (strncmp(diag, "N", 1)==0);

/*     Set up the start point in X if the increment is not unity. This   
       will be  ( N - 1 )*INCX  too small for descending loops. */

    if (*incx <= 0) {
	kx = 1 - (*n - 1) * *incx;
    } else if (*incx != 1) {
	kx = 1;
    }

/*     Start the operations. In this version the elements of A are   
       accessed sequentially with one pass through A. */

    if (strncmp(trans, "N", 1)==0) {

/*        Form  x := inv( A )*x. */

	if (strncmp(uplo, "U", 1)==0) {
	    if (*incx == 1) {
		for (j = *n; j >= 1; --j) {
		    if (X(j) != 0.) {
			if (nounit) {
			    X(j) /= A(j,j);
			}
			temp = X(j);
			for (i = j - 1; i >= 1; --i) {
			    X(i) -= temp * A(i,j);
/* L10: */
			}
		    }
/* L20: */
		}
	    } else {
		jx = kx + (*n - 1) * *incx;
		for (j = *n; j >= 1; --j) {
		    if (X(jx) != 0.) {
			if (nounit) {
			    X(jx) /= A(j,j);
			}
			temp = X(jx);
			ix = jx;
			for (i = j - 1; i >= 1; --i) {
			    ix -= *incx;
			    X(ix) -= temp * A(i,j);
/* L30: */
			}
		    }
		    jx -= *incx;
/* L40: */
		}
	    }
	} else {
	    if (*incx == 1) {
		for (j = 1; j <= *n; ++j) {
		    if (X(j) != 0.) {
			if (nounit) {
			    X(j) /= A(j,j);
			}
			temp = X(j);
			for (i = j + 1; i <= *n; ++i) {
			    X(i) -= temp * A(i,j);
/* L50: */
			}
		    }
/* L60: */
		}
	    } else {
		jx = kx;
		for (j = 1; j <= *n; ++j) {
		    if (X(jx) != 0.) {
			if (nounit) {
			    X(jx) /= A(j,j);
			}
			temp = X(jx);
			ix = jx;
			for (i = j + 1; i <= *n; ++i) {
			    ix += *incx;
			    X(ix) -= temp * A(i,j);
/* L70: */
			}
		    }
		    jx += *incx;
/* L80: */
		}
	    }
	}
    } else {

/*        Form  x := inv( A' )*x. */

	if (strncmp(uplo, "U", 1)==0) {
	    if (*incx == 1) {
		for (j = 1; j <= *n; ++j) {
		    temp = X(j);
		    for (i = 1; i <= j-1; ++i) {
			temp -= A(i,j) * X(i);
/* L90: */
		    }
		    if (nounit) {
			temp /= A(j,j);
		    }
		    X(j) = temp;
/* L100: */
		}
	    } else {
		jx = kx;
		for (j = 1; j <= *n; ++j) {
		    temp = X(jx);
		    ix = kx;
		    for (i = 1; i <= j-1; ++i) {
			temp -= A(i,j) * X(ix);
			ix += *incx;
/* L110: */
		    }
		    if (nounit) {
			temp /= A(j,j);
		    }
		    X(jx) = temp;
		    jx += *incx;
/* L120: */
		}
	    }
	} else {
	    if (*incx == 1) {
		for (j = *n; j >= 1; --j) {
		    temp = X(j);
		    for (i = *n; i >= j+1; --i) {
			temp -= A(i,j) * X(i);
/* L130: */
		    }
		    if (nounit) {
			temp /= A(j,j);
		    }
		    X(j) = temp;
/* L140: */
		}
	    } else {
		kx += (*n - 1) * *incx;
		jx = kx;
		for (j = *n; j >= 1; --j) {
		    temp = X(jx);
		    ix = kx;
		    for (i = *n; i >= j+1; --i) {
			temp -= A(i,j) * X(ix);
			ix -= *incx;
/* L150: */
		    }
		    if (nounit) {
			temp /= A(j,j);
		    }
		    X(jx) = temp;
		    jx -= *incx;
/* L160: */
		}
	    }
	}
    }

    return;

/*     End of DTRSV . */

}